

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::GridDataType1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType1 *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  GridData::GetAsString_abi_cxx11_(&local_1d0,&this->super_GridData);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"GridDataType1:",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tField Scale:      ",0x14);
  poVar2 = std::ostream::_M_insert<double>((double)*(float *)&(this->super_GridData).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tField Offset:     ",0x14);
  poVar2 = std::ostream::_M_insert<double>((double)(float)this->m_f32FieldOffset);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tNumber Of Values: ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tValues: ",10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  puVar1 = (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_vui16Values).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType1::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType1:"
       << "\n\tField Scale:      " << m_f32FieldScale
       << "\n\tField Offset:     " << m_f32FieldOffset
       << "\n\tNumber Of Values: " << m_ui16NumValues
       << "\n\tValues: ";

    vector<KUINT16>::const_iterator citr = m_vui16Values.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vui16Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << *citr;
    }
    ss << "\n";

    return ss.str();
}